

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

vm_obj_id_t CVmObjFileName::create_from_local(char *str,size_t len)

{
  vm_obj_id_t obj_id;
  char *in_RSI;
  undefined8 in_RDI;
  vm_obj_id_t id;
  CVmObjFileName *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int32_t sfid;
  
  sfid = (int32_t)((ulong)in_RDI >> 0x20);
  obj_id = vm_new_id((int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_stack_ffffffffffffffec);
  CVmObject::operator_new((size_t)in_RSI,obj_id);
  CVmObjFileName(unaff_retaddr,sfid,in_RSI,CONCAT44(obj_id,in_stack_ffffffffffffffe8));
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_local(VMG_ const char *str, size_t len)
{
    /* allocate the new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create the object */
    new (vmg_ id) CVmObjFileName(vmg_ 0, str, len);

    /* return the new ID */
    return id;
}